

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCLoader.cpp
# Opt level: O3

void __thiscall Assimp::IFCImporter::SetupProperties(IFCImporter *this,Importer *pImp)

{
  int iVar1;
  int iVar2;
  ai_real aVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS",1);
  (this->settings).skipSpaceRepresentations = iVar1 != 0;
  iVar1 = Importer::GetPropertyInteger(pImp,"IMPORT_IFC_CUSTOM_TRIANGULATION",1);
  (this->settings).useCustomTriangulation = iVar1 != 0;
  aVar3 = Importer::GetPropertyFloat(pImp,"IMPORT_IFC_SMOOTHING_ANGLE",10.0);
  fVar5 = 5.0;
  if (5.0 <= aVar3) {
    fVar5 = aVar3;
  }
  fVar4 = 120.0;
  if (fVar5 <= 120.0) {
    fVar4 = fVar5;
  }
  (this->settings).conicSamplingAngle = fVar4;
  iVar2 = Importer::GetPropertyInteger(pImp,"IMPORT_IFC_CYLINDRICAL_TESSELLATION",0x20);
  iVar1 = 3;
  if (3 < iVar2) {
    iVar1 = iVar2;
  }
  if (0xb3 < iVar1) {
    iVar1 = 0xb4;
  }
  (this->settings).cylindricalTessellation = iVar1;
  (this->settings).skipAnnotations = true;
  return;
}

Assistant:

void IFCImporter::SetupProperties(const Importer* pImp)
{
    settings.skipSpaceRepresentations = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_SKIP_SPACE_REPRESENTATIONS,true);
    settings.useCustomTriangulation = pImp->GetPropertyBool(AI_CONFIG_IMPORT_IFC_CUSTOM_TRIANGULATION,true);
    settings.conicSamplingAngle = std::min(std::max((float) pImp->GetPropertyFloat(AI_CONFIG_IMPORT_IFC_SMOOTHING_ANGLE, AI_IMPORT_IFC_DEFAULT_SMOOTHING_ANGLE), 5.0f), 120.0f);
	settings.cylindricalTessellation = std::min(std::max(pImp->GetPropertyInteger(AI_CONFIG_IMPORT_IFC_CYLINDRICAL_TESSELLATION, AI_IMPORT_IFC_DEFAULT_CYLINDRICAL_TESSELLATION), 3), 180);
	settings.skipAnnotations = true;
}